

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::EndChild(void)

{
  ImGuiWindow *pIVar1;
  ImGuiWindow *pIVar2;
  ImGuiContext *pIVar3;
  float fVar4;
  ImVec2 sz;
  ImRect bb;
  ImVec2 local_40;
  ImRect local_38;
  ImRect local_28;
  
  pIVar3 = GImGui;
  if (GImGui->WithinEndChild != false) {
    __assert_fail("g.WithinEndChild == false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kentril0[P]OpenGL_Atmospheric_Scattering/src/libs/imgui/imgui.cpp"
                  ,0x12d8,"void ImGui::EndChild()");
  }
  pIVar1 = GImGui->CurrentWindow;
  if ((pIVar1->Flags & 0x1000000) != 0) {
    GImGui->WithinEndChild = true;
    if (pIVar1->BeginCount < 2) {
      local_40 = pIVar1->Size;
      if ((pIVar1->AutoFitChildAxises & 1U) != 0) {
        fVar4 = 4.0;
        if (4.0 <= local_40.x) {
          fVar4 = local_40.x;
        }
        local_40.x = fVar4;
      }
      if ((pIVar1->AutoFitChildAxises & 2U) != 0) {
        fVar4 = 4.0;
        if (4.0 <= local_40.y) {
          fVar4 = local_40.y;
        }
        local_40.y = fVar4;
      }
      End();
      pIVar2 = pIVar3->CurrentWindow;
      local_38.Max.x = (pIVar2->DC).CursorPos.x + local_40.x;
      local_38.Max.y = (pIVar2->DC).CursorPos.y + local_40.y;
      local_38.Min = (pIVar2->DC).CursorPos;
      ItemSize(&local_40,-1.0);
      if ((((pIVar1->DC).NavLayerActiveMask == 0) && ((pIVar1->DC).NavHasScroll != true)) ||
         ((pIVar1->Flags & 0x800000) != 0)) {
        ItemAdd(&local_38,0,(ImRect *)0x0);
      }
      else {
        ItemAdd(&local_38,pIVar1->ChildId,(ImRect *)0x0);
        RenderNavHighlight(&local_38,pIVar1->ChildId,1);
        if (((pIVar1->DC).NavLayerActiveMask == 0) && (pIVar1 == pIVar3->NavWindow)) {
          local_28.Min.x = local_38.Min.x + -2.0;
          local_28.Min.y = local_38.Min.y + -2.0;
          local_28.Max.x = local_38.Max.x + 2.0;
          local_28.Max.y = local_38.Max.y + 2.0;
          RenderNavHighlight(&local_28,pIVar3->NavId,2);
        }
      }
    }
    else {
      End();
    }
    pIVar3->WithinEndChild = false;
    return;
  }
  __assert_fail("window->Flags & ImGuiWindowFlags_ChildWindow",
                "/workspace/llm4binary/github/license_all_cmakelists_25/kentril0[P]OpenGL_Atmospheric_Scattering/src/libs/imgui/imgui.cpp"
                ,0x12d9,"void ImGui::EndChild()");
}

Assistant:

void ImGui::EndChild()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    IM_ASSERT(g.WithinEndChild == false);
    IM_ASSERT(window->Flags & ImGuiWindowFlags_ChildWindow);   // Mismatched BeginChild()/EndChild() calls

    g.WithinEndChild = true;
    if (window->BeginCount > 1)
    {
        End();
    }
    else
    {
        ImVec2 sz = window->Size;
        if (window->AutoFitChildAxises & (1 << ImGuiAxis_X)) // Arbitrary minimum zero-ish child size of 4.0f causes less trouble than a 0.0f
            sz.x = ImMax(4.0f, sz.x);
        if (window->AutoFitChildAxises & (1 << ImGuiAxis_Y))
            sz.y = ImMax(4.0f, sz.y);
        End();

        ImGuiWindow* parent_window = g.CurrentWindow;
        ImRect bb(parent_window->DC.CursorPos, parent_window->DC.CursorPos + sz);
        ItemSize(sz);
        if ((window->DC.NavLayerActiveMask != 0 || window->DC.NavHasScroll) && !(window->Flags & ImGuiWindowFlags_NavFlattened))
        {
            ItemAdd(bb, window->ChildId);
            RenderNavHighlight(bb, window->ChildId);

            // When browsing a window that has no activable items (scroll only) we keep a highlight on the child
            if (window->DC.NavLayerActiveMask == 0 && window == g.NavWindow)
                RenderNavHighlight(ImRect(bb.Min - ImVec2(2, 2), bb.Max + ImVec2(2, 2)), g.NavId, ImGuiNavHighlightFlags_TypeThin);
        }
        else
        {
            // Not navigable into
            ItemAdd(bb, 0);
        }
    }
    g.WithinEndChild = false;
}